

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Node * TagToken(TidyDocImpl *doc,NodeType type)

{
  uint uVar1;
  Lexer *lexer;
  Node *node;
  tmbstr ptVar2;
  
  lexer = doc->lexer;
  node = prvTidyNewNode(lexer->allocator,lexer);
  node->type = type;
  ptVar2 = prvTidytmbstrndup(doc->allocator,lexer->lexbuf + lexer->txtstart,
                             lexer->txtend - lexer->txtstart);
  node->element = ptVar2;
  uVar1 = lexer->txtstart;
  node->start = uVar1;
  node->end = uVar1;
  if (type - StartTag < 2) {
    prvTidyFindTag(doc,node);
  }
  return node;
}

Assistant:

static Node* TagToken( TidyDocImpl* doc, NodeType type )
{
    Lexer* lexer = doc->lexer;
    Node* node = TY_(NewNode)( lexer->allocator, lexer );
    node->type = type;
    node->element = TY_(tmbstrndup)( doc->allocator,
                                     lexer->lexbuf + lexer->txtstart,
                                     lexer->txtend - lexer->txtstart );
    node->start = lexer->txtstart;
    node->end = lexer->txtstart;

    if ( type == StartTag || type == StartEndTag || type == EndTag )
        TY_(FindTag)(doc, node);

    return node;
}